

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
SubcommandProgram_OrderedExtras_Test::TestBody(SubcommandProgram_OrderedExtras_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  allocator local_144;
  allocator local_143;
  allocator_type local_142;
  allocator local_141;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  AssertionResult gtest_ar;
  allocator_type local_111;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  allocator_type local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  (this->super_SubcommandProgram).super_TApp.app.allow_extras_ = true;
  std::__cxx11::string::string((string *)&local_f0,"one",(allocator *)&local_140);
  std::__cxx11::string::string(local_d0,"two",(allocator *)&local_110);
  std::__cxx11::string::string(local_b0,"start",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_90,"three",&local_143);
  std::__cxx11::string::string(local_70,"four",&local_144);
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_f0,
             local_50);
  this_00 = &(this->super_SubcommandProgram).super_TApp.app;
  lVar4 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)&local_f0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_140,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x24c,
             "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_f0);
  CLI::App::reset(this_00);
  ((this->super_SubcommandProgram).start)->allow_extras_ = true;
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_140,this_00,false);
  std::__cxx11::string::string((string *)&local_f0,"one",&local_143);
  std::__cxx11::string::string(local_d0,"two",&local_144);
  __l._M_len = 2;
  __l._M_array = &local_f0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l,&local_142);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"app.remaining()","std::vector<std::string>({\"one\", \"two\"})",
             &local_140,&local_110);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x253,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::remaining_abi_cxx11_(&local_140,(this->super_SubcommandProgram).start,false);
  std::__cxx11::string::string((string *)&local_f0,"three",&local_143);
  std::__cxx11::string::string(local_d0,"four",&local_144);
  __l_00._M_len = 2;
  __l_00._M_array = &local_f0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_00,&local_142);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"start->remaining()",
             "std::vector<std::string>({\"three\", \"four\"})",&local_140,&local_110);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x254,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::remaining_abi_cxx11_(&local_140,this_00,true);
  std::__cxx11::string::string((string *)&local_f0,"one",&local_143);
  std::__cxx11::string::string(local_d0,"two",&local_144);
  std::__cxx11::string::string(local_b0,"three",(allocator *)&local_142);
  std::__cxx11::string::string(local_90,"four",&local_141);
  __l_01._M_len = 4;
  __l_01._M_array = &local_f0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_01,&local_111);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"app.remaining(true)",
             "std::vector<std::string>({\"one\", \"two\", \"three\", \"four\"})",&local_140,
             &local_110);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  lVar4 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x255,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&local_f0,"one",(allocator *)&local_140);
  std::__cxx11::string::string(local_d0,"two",(allocator *)&local_110);
  std::__cxx11::string::string(local_b0,"start",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_90,"three",&local_143);
  std::__cxx11::string::string(local_70,"--",&local_144);
  std::__cxx11::string::string(local_50,"four",(allocator *)&local_142);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_f0,
             &stack0xffffffffffffffd0);
  lVar4 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_140,this_00,false);
  std::__cxx11::string::string((string *)&local_f0,"one",&local_143);
  std::__cxx11::string::string(local_d0,"two",&local_144);
  __l_02._M_len = 2;
  __l_02._M_array = &local_f0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_02,&local_142);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"app.remaining()","std::vector<std::string>({\"one\", \"two\"})",
             &local_140,&local_110);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x25c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::remaining_abi_cxx11_(&local_140,(this->super_SubcommandProgram).start,false);
  std::__cxx11::string::string((string *)&local_f0,"three",&local_143);
  std::__cxx11::string::string(local_d0,"--",&local_144);
  std::__cxx11::string::string(local_b0,"four",(allocator *)&local_142);
  __l_03._M_len = 3;
  __l_03._M_array = &local_f0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_03,(allocator_type *)&local_141);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"start->remaining()",
             "std::vector<std::string>({\"three\", \"--\", \"four\"})",&local_140,&local_110);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x25d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::remaining_abi_cxx11_(&local_140,this_00,true);
  std::__cxx11::string::string((string *)&local_f0,"one",&local_143);
  std::__cxx11::string::string(local_d0,"two",&local_144);
  std::__cxx11::string::string(local_b0,"three",(allocator *)&local_142);
  std::__cxx11::string::string(local_90,"--",&local_141);
  std::__cxx11::string::string(local_70,"four",(allocator *)&local_111);
  __l_04._M_len = 5;
  __l_04._M_array = &local_f0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_04,&local_f1);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"app.remaining(true)",
             "std::vector<std::string>({\"one\", \"two\", \"three\", \"--\", \"four\"})",&local_140,
             &local_110);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  lVar4 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x25e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SubcommandProgram, OrderedExtras) {

    app.allow_extras();
    args = {"one", "two", "start", "three", "four"};
    EXPECT_THROW(run(), CLI::ExtrasError);
    app.reset();

    start->allow_extras();

    run();

    EXPECT_EQ(app.remaining(), std::vector<std::string>({"one", "two"}));
    EXPECT_EQ(start->remaining(), std::vector<std::string>({"three", "four"}));
    EXPECT_EQ(app.remaining(true), std::vector<std::string>({"one", "two", "three", "four"}));

    app.reset();
    args = {"one", "two", "start", "three", "--", "four"};

    run();

    EXPECT_EQ(app.remaining(), std::vector<std::string>({"one", "two"}));
    EXPECT_EQ(start->remaining(), std::vector<std::string>({"three", "--", "four"}));
    EXPECT_EQ(app.remaining(true), std::vector<std::string>({"one", "two", "three", "--", "four"}));
}